

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio.c
# Opt level: O3

size_t fwrite(void *__ptr,size_t __size,size_t __n,FILE *__s)

{
  int iVar1;
  size_t i;
  size_t sVar2;
  
  if (__size == 0 || __n == 0) {
    __n = 0;
  }
  else {
    sVar2 = 0;
    do {
      iVar1 = _Write((FILE *)__s,__ptr,__size);
      if (iVar1 < 0) {
        return sVar2;
      }
      sVar2 = sVar2 + 1;
      __ptr = (void *)((long)__ptr + __size);
    } while (__n != sVar2);
  }
  return __n;
}

Assistant:

size_t fwrite(const void *restrict buffer, size_t size, size_t count, FILE *restrict stream) {
    if (count == 0 || size == 0) {
        return 0;
    }

    const unsigned char *const b = buffer;
    for (size_t i = 0; i < count; ++i) {
        if (_Write(stream, b + i * size, size) < 0) {
            return i;
        }
    }

    return count;
}